

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Indexing::CodeTree::MatchInfo_*>::~DArray(DArray<Indexing::CodeTree::MatchInfo_*> *this)

{
  if (this->_array != (MatchInfo **)0x0) {
    Lib::free(this->_array);
  }
  return;
}

Assistant:

inline ~DArray()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
  }